

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

pair<bool,_bool> kratos::correct_port_direction(Port *port1,Port *port2,Generator *top)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Generator *pGVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Port *pPVar5;
  ushort uVar6;
  byte bVar7;
  shared_ptr<kratos::AssignStmt> stmt;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  long local_38;
  Generator *pGVar3;
  undefined4 extraout_var_00;
  
  iVar2 = (*(port1->super_Var).super_IRNode._vptr_IRNode[0xd])();
  pGVar3 = (Generator *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(port2->super_Var).super_IRNode._vptr_IRNode[0xd])(port2);
  pGVar4 = (Generator *)CONCAT44(extraout_var_00,iVar2);
  stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  if (pGVar3 == top && pGVar3 == pGVar4) {
    iVar2 = (*(port1->super_Var).super_IRNode._vptr_IRNode[0x1d])(port1);
    if ((char)iVar2 == '\0') {
LAB_0015b713:
      iVar2 = (*(port2->super_Var).super_IRNode._vptr_IRNode[0x1d])(port2);
      if ((char)iVar2 != '\0') {
        iVar2 = (*(port1->super_Var).super_IRNode._vptr_IRNode[0x1d])(port1);
        pPVar5 = port2;
        if ((char)iVar2 == '\0') goto LAB_0015b808;
      }
      bVar7 = false;
    }
    else {
      iVar2 = (*(port2->super_Var).super_IRNode._vptr_IRNode[0x1d])(port2);
      pPVar5 = port1;
      if ((char)iVar2 != '\0') goto LAB_0015b713;
LAB_0015b808:
      bVar7 = *(byte *)(pPVar5[1].super_Var.super_IRNode._vptr_IRNode + 0x10) ^ 1;
    }
    check_direction(port1,port2,(bool)bVar7);
    bVar7 = bVar7 ^ port1->direction_ != In;
  }
  else if (pGVar3 == top) {
    std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::Generator,void>
              ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)
               &stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
               &pGVar4->super_enable_shared_from_this<kratos::Generator>);
    bVar1 = Generator::has_child_generator
                      (top,(shared_ptr<kratos::Generator> *)
                           &stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    local_38 = CONCAT71(local_38._1_7_,bVar1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
    if ((char)local_38 == '\0') goto LAB_0015b790;
    check_direction(port1,port2,true);
    bVar7 = port1->direction_ != In;
  }
  else {
LAB_0015b790:
    if (pGVar4 != top) {
LAB_0015b7d4:
      iVar2 = (*(pGVar3->super_IRNode)._vptr_IRNode[4])(pGVar3);
      local_38 = CONCAT44(extraout_var_01,iVar2);
      iVar2 = (*(pGVar4->super_IRNode)._vptr_IRNode[4])(pGVar4);
      if (local_38 == CONCAT44(extraout_var_02,iVar2)) {
        iVar2 = (*(pGVar3->super_IRNode)._vptr_IRNode[4])(pGVar3);
        if ((Generator *)CONCAT44(extraout_var_03,iVar2) == top) {
          check_direction(port1,port2,false);
          goto LAB_0015b868;
        }
      }
      bVar7 = 0;
      uVar6 = 0;
      goto LAB_0015b83a;
    }
    std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::Generator,void>
              ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)
               &stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
               &pGVar3->super_enable_shared_from_this<kratos::Generator>);
    bVar1 = Generator::has_child_generator
                      (top,(shared_ptr<kratos::Generator> *)
                           &stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    local_38 = CONCAT71(local_38._1_7_,bVar1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
    if ((char)local_38 == '\0') goto LAB_0015b7d4;
    check_direction(port1,port2,true);
LAB_0015b868:
    bVar7 = port1->direction_ == In;
  }
  uVar6 = 0x100;
LAB_0015b83a:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  return (pair<bool,_bool>)(uVar6 | bVar7);
}

Assistant:

std::pair<bool, bool> correct_port_direction(Port *port1, Port *port2, Generator *top) {
    auto *parent1 = port1->generator();
    auto *parent2 = port2->generator();
    std::shared_ptr<AssignStmt> stmt;
    if (parent1 == parent2 && parent1 == top) {
        // it's the same module
        // by default same direction is fault, however, for modport ones, it is the same direction
        bool interface_port_wire = false;
        if (port1->is_interface() && !port2->is_interface()) {
            auto *port_i = reinterpret_cast<InterfacePort *>(port1);
            const auto *it = port_i->interface();
            interface_port_wire = !it->is_port();
        } else if (port2->is_interface() && !port1->is_interface()) {
            auto *port_i = reinterpret_cast<InterfacePort *>(port2);
            const auto *it = port_i->interface();
            interface_port_wire = !it->is_port();
        }
        check_direction(port1, port2, interface_port_wire);
        bool dir_in = port1->port_direction() == PortDirection::In;
        return {(interface_port_wire == dir_in), true};
    } else {
        if (parent1 == top && top->has_child_generator(parent2->shared_from_this())) {
            check_direction(port1, port2, true);
            return {port1->port_direction() != PortDirection::In, true};
        } else if (parent2 == top && top->has_child_generator(parent1->shared_from_this())) {
            check_direction(port1, port2, true);
            return {(port1->port_direction() == PortDirection::In), true};
        } else if (parent1->parent() == parent2->parent() && parent1->parent() == top) {
            check_direction(port1, port2, false);
            return {(port1->port_direction() == PortDirection::In), true};
        } else {
            return {false, false};
        }
    }
}